

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

double __thiscall doctest::detail::MessageBuilder::log(MessageBuilder *this,double __x)

{
  int *piVar1;
  char *pcVar2;
  undefined8 *puVar3;
  long lVar4;
  ulong uVar5;
  IReporter **curr_rep;
  undefined8 *puVar6;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  anon_union_24_2_13149d16_for_String_2 local_38;
  
  if (this->logged == false) {
    tlssPop();
    if (&local_38 == (anon_union_24_2_13149d16_for_String_2 *)this) {
      if ((local_38.buf[0x17] < '\0') && (local_38.data.ptr != (char *)0x0)) {
        operator_delete__(local_38.data.ptr);
      }
    }
    else {
      if (((this->super_MessageData).m_string.field_0.buf[0x17] < '\0') &&
         (pcVar2 = (this->super_MessageData).m_string.field_0.data.ptr, pcVar2 != (char *)0x0)) {
        operator_delete__(pcVar2);
      }
      *(ulong *)((long)&(this->super_MessageData).m_string.field_0 + 0x10) =
           CONCAT17(local_38.buf[0x17],local_38._16_7_);
      (this->super_MessageData).m_string.field_0.data.ptr = local_38.data.ptr;
      *(undefined8 *)((long)&(this->super_MessageData).m_string.field_0 + 8) = local_38._8_8_;
    }
    this->logged = true;
  }
  puVar3 = *(undefined8 **)(g_cs + 0x10d8);
  for (puVar6 = *(undefined8 **)(g_cs + 0x10d0); puVar6 != puVar3; puVar6 = puVar6 + 1) {
    (**(code **)(*(long *)*puVar6 + 0x50))((long *)*puVar6,this);
  }
  if (((this->super_MessageData).m_severity & is_warn) == 0) {
    lVar4 = g_cs + 0xb8;
    if (*(char *)(in_FS_OFFSET + -0x70) == '\0') {
      LOCK();
      UNLOCK();
      uVar5 = (ulong)((uint)MultiLaneAtomic<int>::myAtomic()::laneCounter & 0x1f);
      MultiLaneAtomic<int>::myAtomic()::laneCounter =
           MultiLaneAtomic<int>::myAtomic()::laneCounter + 1;
      *(ulong *)(in_FS_OFFSET + -0x78) = uVar5;
      *(undefined1 *)(in_FS_OFFSET + -0x70) = 1;
    }
    else {
      uVar5 = *(ulong *)(in_FS_OFFSET + -0x78);
    }
    LOCK();
    piVar1 = (int *)(lVar4 + uVar5 * 0x40);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    if (((this->super_MessageData).m_severity & is_warn) == 0) {
      lVar4 = g_cs + 0x8b8;
      if (*(char *)(in_FS_OFFSET + -0x70) == '\0') {
        LOCK();
        UNLOCK();
        uVar5 = (ulong)((uint)MultiLaneAtomic<int>::myAtomic()::laneCounter & 0x1f);
        MultiLaneAtomic<int>::myAtomic()::laneCounter =
             MultiLaneAtomic<int>::myAtomic()::laneCounter + 1;
        *(ulong *)(in_FS_OFFSET + -0x78) = uVar5;
        *(undefined1 *)(in_FS_OFFSET + -0x70) = 1;
      }
      else {
        uVar5 = *(ulong *)(in_FS_OFFSET + -0x78);
      }
      LOCK();
      piVar1 = (int *)(lVar4 + uVar5 * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  isDebuggerActive();
  return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
}

Assistant:

bool MessageBuilder::log() {
        if (!logged) {
            m_string = tlssPop();
            logged = true;
        }

        DOCTEST_ITERATE_THROUGH_REPORTERS(log_message, *this);

        const bool isWarn = m_severity & assertType::is_warn;

        // warn is just a message in this context so we don't treat it as an assert
        if(!isWarn) {
            addAssert(m_severity);
            addFailedAssert(m_severity);
        }

        return isDebuggerActive() && !getContextOptions()->no_breaks && !isWarn &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }